

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O3

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  char cVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  nn_trie_node *pnVar10;
  nn_trie_node **self_00;
  nn_trie_node *pnVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long *plVar15;
  long lVar16;
  size_t size_00;
  ulong uVar17;
  byte *pbVar18;
  
  pnVar10 = *self;
  if (size != 0) {
    bVar4 = pnVar10->prefix_len;
    uVar17 = (ulong)bVar4;
    uVar9 = 0;
    if (bVar4 == 0) {
LAB_001143a3:
      if ((uint)uVar9 != (uint)bVar4) {
        return 0;
      }
      uVar17 = (ulong)(uint)bVar4;
    }
    else {
      uVar9 = 0;
      do {
        if (size == uVar9) {
          uVar9 = size & 0xffffffff;
          goto LAB_001143a3;
        }
        if (pnVar10->prefix[uVar9] != data[uVar9]) goto LAB_001143a3;
        uVar9 = uVar9 + 1;
      } while (uVar17 != uVar9);
    }
    if (uVar17 != size) {
      pbVar18 = data + uVar17;
      self_00 = nn_node_next(pnVar10,*pbVar18);
      if (self_00 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar7 = nn_node_unsubscribe(self_00,pbVar18 + 1,~uVar17 + size);
      if (iVar7 == 0) {
        return 0;
      }
      if (*self_00 != (nn_trie_node *)0x0) {
        return 1;
      }
      pnVar10 = *self;
      bVar4 = pnVar10->type;
      if (bVar4 < 9) {
        uVar14 = (uint)bVar4;
        if (bVar4 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            if (pnVar10->prefix[uVar9 + 10] == *pbVar18) goto LAB_00114540;
            uVar9 = uVar9 + 1;
          } while (uVar14 != uVar9);
          uVar9 = (ulong)uVar14;
        }
LAB_00114540:
        uVar17 = uVar9 & 0xffffffff;
        memmove(pnVar10->prefix + uVar17 + 10,pnVar10->prefix + uVar17 + 0xb,
                (long)(int)(uVar14 + ~(uint)uVar9));
        pnVar10 = *self;
        memmove(pnVar10[1].prefix + uVar17 * 8 + -6,pnVar10[1].prefix + uVar17 * 8 + 2,
                ((long)(int)~(uint)uVar9 + (ulong)pnVar10->type) * 8);
        pnVar10 = *self;
        bVar4 = pnVar10->type - 1;
        pnVar10->type = bVar4;
        pnVar10 = (nn_trie_node *)nn_realloc(pnVar10,(ulong)bVar4 * 8 + 0x18);
        *self = pnVar10;
        if ((pnVar10->type == '\0') && (pnVar10->refcount == 0)) {
          nn_free(pnVar10);
          *self = (nn_trie_node *)0x0;
          return 1;
        }
        pnVar10 = nn_node_compact(pnVar10);
      }
      else {
        uVar3 = (pnVar10->u).dense.nbr;
        if (uVar3 < 10) {
          pnVar11 = (nn_trie_node *)nn_alloc_(0x58);
          pnVar11->refcount = 0;
          pnVar10 = *self;
          bVar4 = pnVar10->prefix_len;
          pnVar11->prefix_len = bVar4;
          memcpy(pnVar11->prefix,pnVar10->prefix,(ulong)bVar4);
          pnVar11->type = '\b';
          pnVar10 = *self;
          bVar4 = (pnVar10->u).sparse.children[0];
          uVar14 = (uint)bVar4;
          if ((pnVar10->u).sparse.children[1] + 1 != (uint)bVar4) {
            uVar9 = 0;
            iVar7 = 0;
            do {
              lVar16 = *(long *)(pnVar10[1].prefix + uVar9 * 8 + -6);
              if (lVar16 != 0) {
                pnVar11->prefix[(long)iVar7 + 10] = (char)uVar14 + (char)uVar9;
                *(long *)(pnVar11[1].prefix + (long)iVar7 * 8 + -6) = lVar16;
                iVar7 = iVar7 + 1;
                pnVar10 = *self;
              }
              uVar9 = uVar9 + 1;
              uVar14 = (uint)(pnVar10->u).sparse.children[0];
            } while (uVar9 != ((pnVar10->u).sparse.children[1] - uVar14) + 1);
          }
          nn_free(pnVar10);
          *self = pnVar11;
          return 1;
        }
        bVar4 = *pbVar18;
        bVar2 = (pnVar10->u).sparse.children[0];
        uVar14 = (uint)bVar2;
        if (bVar4 == bVar2) {
          pnVar11 = pnVar10 + 1;
          uVar8 = (uint)(pnVar10->u).sparse.children[1];
          uVar12 = uVar8 - uVar14;
          if (uVar12 == 0xffffffff) {
            uVar13 = 0;
          }
          else {
            uVar13 = uVar12 + 1;
            lVar16 = 0;
            do {
              if (*(long *)(pnVar11->prefix + lVar16 * 8 + -6) != 0) {
                uVar13 = (uint)lVar16;
                break;
              }
              lVar16 = lVar16 + 1;
            } while ((ulong)uVar12 + 1 != lVar16);
          }
          iVar7 = uVar14 + uVar13;
          memmove(pnVar11,pnVar11->prefix + (ulong)uVar13 * 8 + -6,
                  (long)(int)((uVar8 - iVar7) + 1) << 3);
          ((*self)->u).sparse.children[0] = (uint8_t)iVar7;
          puVar1 = &((*self)->u).dense.nbr;
          *puVar1 = *puVar1 - 1;
          pnVar10 = *self;
          size_00 = (long)(int)(((uint)(pnVar10->u).sparse.children[1] - iVar7) + 1) * 8 + 0x18;
        }
        else {
          if (bVar4 != (pnVar10->u).sparse.children[1]) {
            (pnVar10->u).dense.nbr = uVar3 - 1;
            return 1;
          }
          uVar9 = (ulong)uVar14;
          plVar15 = (long *)((long)pnVar10 + ((ulong)bVar4 * 8 - (ulong)((uint)bVar2 * 8)) + 0x18);
          do {
            if (*plVar15 != 0) {
              cVar5 = bVar4 - (char)uVar9;
              goto LAB_00114650;
            }
            uVar9 = uVar9 + 1;
            plVar15 = plVar15 + -1;
          } while (bVar4 != uVar9);
          cVar5 = '\0';
LAB_00114650:
          (pnVar10->u).sparse.children[1] = bVar2 + cVar5;
          puVar1 = &((*self)->u).dense.nbr;
          *puVar1 = *puVar1 - 1;
          pnVar10 = *self;
          size_00 = ((ulong)(pnVar10->u).sparse.children[1] - (ulong)(pnVar10->u).sparse.children[0]
                    ) * 8 + 0x20;
        }
        pnVar10 = (nn_trie_node *)nn_realloc(pnVar10,size_00);
      }
      *self = pnVar10;
      return 1;
    }
  }
  iVar7 = -0x16;
  if ((pnVar10 != (nn_trie_node *)0x0) && (pnVar10->refcount != 0)) {
    iVar7 = 0;
    uVar6 = pnVar10->refcount - 1;
    pnVar10->refcount = uVar6;
    if (uVar6 == 0) {
      iVar7 = 1;
      if (pnVar10->type == '\0') {
        nn_free(pnVar10);
        *self = (nn_trie_node *)0x0;
      }
      else {
        pnVar10 = nn_node_compact(pnVar10);
        *self = pnVar10;
      }
    }
  }
  return iVar7;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}